

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope::getUri(Scope *this,XMLCh *prefix)

{
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar1;
  bool bVar2;
  ulong uVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  RefHashTableBucketElem<char16_t> *pRVar6;
  
  while (pRVar1 = this->fPrefixHash,
        pRVar1 == (RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) {
    this = this->fBaseScopeWithBindings;
    if (this == (Scope *)0x0) {
      return (XMLCh *)0x0;
    }
  }
  if ((prefix == (XMLCh *)0x0) || (uVar3 = (ulong)(ushort)*prefix, uVar3 == 0)) {
    uVar3 = 0;
  }
  else {
    XVar5 = prefix[1];
    if (XVar5 != L'\0') {
      pXVar4 = prefix + 2;
      do {
        uVar3 = (ulong)(ushort)XVar5 + (uVar3 >> 0x18) + uVar3 * 0x26;
        XVar5 = *pXVar4;
        pXVar4 = pXVar4 + 1;
      } while (XVar5 != L'\0');
    }
    uVar3 = uVar3 % pRVar1->fHashModulus;
  }
  pRVar6 = pRVar1->fBucketList[uVar3];
  if (pRVar6 != (RefHashTableBucketElem<char16_t> *)0x0) {
    do {
      bVar2 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefix,pRVar6->fKey);
      if (bVar2) goto LAB_0027d966;
      pRVar6 = pRVar6->fNext;
    } while (pRVar6 != (RefHashTableBucketElem<char16_t> *)0x0);
  }
  pRVar6 = (RefHashTableBucketElem<char16_t> *)0x0;
LAB_0027d966:
  if (pRVar6 == (RefHashTableBucketElem<char16_t> *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    pXVar4 = pRVar6->fData;
  }
  return pXVar4;
}

Assistant:

const XMLCh* DOMNormalizer::InScopeNamespaces::Scope::getUri(const XMLCh *prefix) const {
    const XMLCh* uri = 0;

    if(fPrefixHash) {
        uri = fPrefixHash->get(prefix);
    }
    else if(fBaseScopeWithBindings) {
        uri = fBaseScopeWithBindings->getUri(prefix);
    }

    return uri ? uri : 0;
}